

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushPolicyBarrier(cmMakefile *this)

{
  size_type local_18;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_10 = this;
  local_18 = std::
             vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::
             size(&this->PolicyStack);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->PolicyBarriers,&local_18);
  return;
}

Assistant:

void cmMakefile::PushPolicyBarrier()
{
  this->PolicyBarriers.push_back(this->PolicyStack.size());
}